

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O2

void writeKeys<unsigned_short>
               (string *str,vector<unsigned_short,_std::allocator<unsigned_short>_> *keys,
               string *key_type,vector<int,_std::allocator<int>_> *mapping,size_t n)

{
  int *piVar1;
  long lVar2;
  int *piVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,"    static constexpr std::array<",key_type);
  std::operator+(&local_70,&local_50,", ");
  std::__cxx11::to_string(&local_90,n + 1);
  std::operator+(&local_d0,&local_70,&local_90);
  std::operator+(&local_b0,&local_d0,"> keys {\n        ");
  std::__cxx11::string::append((string *)str);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  piVar3 = (mapping->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (mapping->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar4 = 0;
  lVar2 = 0;
  while( true ) {
    if (piVar3 == piVar1) break;
    if ((lVar2 != 0) && (lVar2 + (uVar4 / 10) * 10 == 0)) {
      std::__cxx11::string::append((char *)str);
    }
    if ((long)*piVar3 == -1) {
      std::__cxx11::string::append((char *)str);
    }
    else {
      std::__cxx11::to_string
                (&local_d0,
                 (uint)(keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                       _M_impl.super__Vector_impl_data._M_start[*piVar3]);
      std::operator+(&local_b0,&local_d0,",");
      std::__cxx11::string::append((string *)str);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    piVar3 = piVar3 + 1;
    uVar4 = uVar4 + 1;
    lVar2 = lVar2 + -1;
  }
  std::__cxx11::string::append((char *)str);
  return;
}

Assistant:

void writeKeys(std::string& str,
               const std::vector<KeyType>& keys,
               std::string key_type,
               const std::vector<int>& mapping,
               size_t n){
    str += "    static constexpr std::array<" + key_type + ", " + std::to_string(n+1) + "> keys {\n        ";

    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row==0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else    str += std::to_string(keys[val]) + ",";
    }
    str += "\n    };\n";
}